

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::makePitchBend(MidiMessage *this,int channel,int value)

{
  pointer *ppuVar1;
  iterator iVar2;
  byte local_1b;
  byte local_1a;
  byte local_19;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_19 = (byte)channel | 0xe0;
  iVar2._M_current =
       (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_19);
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_19;
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_1a = (byte)value & 0x7f;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_1a);
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_1a;
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_1b = (byte)((uint)value >> 7) & 0x7f;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_1b);
  }
  else {
    *iVar2._M_current = local_1b;
    ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void MidiMessage::makePitchBend(int channel, int value) {
	resize(0);
	int lsb = value & 0x7f;
	int msb = (value >> 7) & 0x7f;
	push_back(0xe0 | (0x7f & channel));
	push_back(lsb);
	push_back(msb);
}